

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Node * __thiscall capnp::compiler::Compiler::Impl::getBuiltin(Impl *this,Which which)

{
  bool bVar1;
  pointer ppVar2;
  uint local_34;
  Fault local_30;
  Fault f;
  _Self local_20;
  iterator iter;
  Which which_local;
  Impl *this_local;
  
  iter._M_node._6_2_ = which;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
       ::find(&this->builtinDeclsByKind,(key_type *)((long)&iter._M_node + 6));
  f.exception = (Exception *)
                std::
                map<capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
                ::end(&this->builtinDeclsByKind);
  bVar1 = std::operator!=(&local_20,(_Self *)&f);
  if (!bVar1) {
    local_34 = (uint)iter._M_node._6_2_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16],unsigned_int>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x4ca,FAILED,"iter != builtinDeclsByKind.end()","\"invalid builtin\", (uint)which",
               (char (*) [16])"invalid builtin",&local_34);
    kj::_::Debug::Fault::fatal(&local_30);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>
           ::operator->(&local_20);
  return ppVar2->second;
}

Assistant:

Compiler::Node& Compiler::Impl::getBuiltin(Declaration::Which which) {
  auto iter = builtinDeclsByKind.find(which);
  KJ_REQUIRE(iter != builtinDeclsByKind.end(), "invalid builtin", (uint)which);
  return *iter->second;
}